

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

int bninchrr(const_bstring b0,int pos,const_bstring b1)

{
  int iVar1;
  undefined1 local_48 [8];
  charField chrs;
  const_bstring b1_local;
  int pos_local;
  const_bstring b0_local;
  
  if ((((pos < 0) || (b0 == (const_bstring)0x0)) || (b0->data == (uchar *)0x0)) || (b0->slen < pos))
  {
    b0_local._4_4_ = -1;
  }
  else {
    b1_local._4_4_ = pos;
    if (pos == b0->slen) {
      b1_local._4_4_ = pos + -1;
    }
    chrs.content._24_8_ = b1;
    iVar1 = buildCharField((charField *)local_48,b1);
    if (iVar1 < 0) {
      b0_local._4_4_ = -1;
    }
    else {
      invertCharField((charField *)local_48);
      b0_local._4_4_ = binchrrCF(b0->data,b1_local._4_4_,(charField *)local_48);
    }
  }
  return b0_local._4_4_;
}

Assistant:

int bninchrr (const_bstring b0, int pos, const_bstring b1) {
struct charField chrs;
	if (pos < 0 || b0 == NULL || b0->data == NULL ||
	    b0->slen < pos) return BSTR_ERR;
	if (pos == b0->slen) pos--;
	if (buildCharField (&chrs, b1) < 0) return BSTR_ERR;
	invertCharField (&chrs);
	return binchrrCF (b0->data, pos, &chrs);
}